

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O2

void __thiscall rengine::OpenGLRenderer::TexturePool::release(TexturePool *this,GLuint id)

{
  GLuint local_c [2];
  GLuint id_local;
  
  local_c[0] = id;
  if (id != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,local_c);
    return;
  }
  __assert_fail("id > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                ,0x3d,"void rengine::OpenGLRenderer::TexturePool::release(GLuint)");
}

Assistant:

void release(GLuint id) {
            assert(id > 0);
            push_back(id);
        }